

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
slang::CommandLine::setPositional
          (CommandLine *this,OptionCallback *cb,string_view valueName,bool isFileName)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this_00;
  element_type *peVar3;
  shared_ptr<slang::CommandLine::Option> local_50 [2];
  byte local_29;
  OptionCallback *pOStack_28;
  bool isFileName_local;
  OptionCallback *cb_local;
  CommandLine *this_local;
  string_view valueName_local;
  
  valueName_local._M_len = (size_t)valueName._M_str;
  this_local = (CommandLine *)valueName._M_len;
  local_29 = isFileName;
  pOStack_28 = cb;
  cb_local = (OptionCallback *)this;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (!bVar2) {
    std::make_shared<slang::CommandLine::Option>();
    std::shared_ptr<slang::CommandLine::Option>::operator=(&this->positional,local_50);
    std::shared_ptr<slang::CommandLine::Option>::~shared_ptr(local_50);
    peVar3 = std::
             __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator=
              ((string *)&peVar3->valueName,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    peVar3 = std::
             __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::
    variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>
    ::operator=((variant<std::optional<bool>*,std::optional<int>*,std::optional<unsigned_int>*,std::optional<long>*,std::optional<unsigned_long>*,std::optional<double>*,std::optional<std::__cxx11::string>*,std::vector<int,std::allocator<int>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<long,std::allocator<long>>*,std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<double,std::allocator<double>>*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>>
                 *)peVar3,cb);
    bVar1 = local_29;
    peVar3 = std::
             __shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<slang::CommandLine::Option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar3->isFileName = (bool)(bVar1 & 1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can only set one positional argument");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CommandLine::setPositional(OptionCallback cb, string_view valueName, bool isFileName) {
    if (positional)
        throw std::runtime_error("Can only set one positional argument");

    positional = std::make_shared<Option>();
    positional->valueName = valueName;
    positional->storage = cb;
    positional->isFileName = isFileName;
}